

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

bool __thiscall QSQLiteResult::prepare(QSQLiteResult *this,QString *query)

{
  sqlite3_stmt **ppStmt;
  QSQLiteResultPrivate *this_00;
  char cVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  ErrorType type;
  bool bVar5;
  EVP_PKEY_CTX *ctx;
  char16_t *zSql;
  QString *descr;
  long in_FS_OFFSET;
  void *pzTail;
  undefined1 local_70 [40];
  long local_48;
  QChar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSQLiteResultPrivate **)&this->field_0x8;
  ctx = (EVP_PKEY_CTX *)query;
  lVar3 = QSqlResult::driver();
  if (lVar3 != 0) {
    plVar4 = (long *)QSqlResult::driver();
    cVar1 = (**(code **)(*plVar4 + 0x60))(plVar4);
    if (cVar1 != '\0') {
      QSqlResult::driver();
      cVar1 = QSqlDriver::isOpenError();
      if (cVar1 == '\0') {
        QSQLiteResultPrivate::cleanup(this_00,ctx);
        (**(code **)(*(long *)this + 0x38))(this,0);
        local_40 = (QChar *)0x0;
        zSql = (query->d).ptr;
        if (zSql == (char16_t *)0x0) {
          zSql = (char16_t *)&QString::_empty;
        }
        ppStmt = &this_00->stmt;
        iVar2 = sqlite3_prepare16_v2
                          (*(sqlite3 **)
                            (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18
                                      + 8) + 0xa8),zSql,(int)(query->d).size * 2 + 2,ppStmt,
                           &local_40);
        if (iVar2 == 0) {
          bVar5 = true;
          if (local_40 == (QChar *)0x0) goto LAB_001131ea;
          QString::QString((QString *)local_70,local_40,-1);
          QString::trimmed_helper((QString *)(local_70 + 0x18));
          if ((QArrayData *)local_70._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_70._24_8_,2,0x10);
            }
          }
          if ((sqlite3_vfs *)local_70._0_8_ != (sqlite3_vfs *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_70._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_70._0_8_,2,0x10);
            }
          }
          if (local_48 == 0) goto LAB_001131ea;
          descr = *(QString **)
                   (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18 + 8) +
                   0xa8);
          QCoreApplication::translate
                    (local_70 + 0x18,"QSQLiteResult",
                     "Unable to execute multiple statements at a time",0);
          type = (ErrorType)(local_70 + 0x18);
        }
        else {
          descr = *(QString **)
                   (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18 + 8) +
                   0xa8);
          QCoreApplication::translate
                    (local_70 + 0x18,"QSQLiteResult","Unable to execute statement",0);
          type = (ErrorType)(local_70 + 0x18);
        }
        qMakeError((sqlite3 *)local_70,descr,type,2);
        (**(code **)(*(long *)this + 0x28))(this,(QSqlError *)local_70);
        QSqlError::~QSqlError((QSqlError *)local_70);
        if ((QArrayData *)local_70._24_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_70._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_70._24_8_,2,0x10);
          }
        }
        if (*ppStmt != (sqlite3_stmt *)0x0) {
          sqlite3_finalize(*ppStmt);
          *ppStmt = (sqlite3_stmt *)0x0;
        }
      }
    }
  }
  bVar5 = false;
LAB_001131ea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResult::prepare(const QString &query)
{
    Q_D(QSQLiteResult);
    if (!driver() || !driver()->isOpen() || driver()->isOpenError())
        return false;

    d->cleanup();

    setSelect(false);

    const void *pzTail = nullptr;
    const auto size = int((query.size() + 1) * sizeof(QChar));

#if (SQLITE_VERSION_NUMBER >= 3003011)
    int res = sqlite3_prepare16_v2(d->drv_d_func()->access, query.constData(), size,
                                   &d->stmt, &pzTail);
#else
    int res = sqlite3_prepare16(d->access, query.constData(), size,
                                &d->stmt, &pzTail);
#endif

    if (res != SQLITE_OK) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                     "Unable to execute statement"), QSqlError::StatementError, res));
        d->finalize();
        return false;
    } else if (pzTail && !QString(reinterpret_cast<const QChar *>(pzTail)).trimmed().isEmpty()) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
            "Unable to execute multiple statements at a time"), QSqlError::StatementError, SQLITE_MISUSE));
        d->finalize();
        return false;
    }
    return true;
}